

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_clsid.cxx
# Opt level: O3

void __thiscall xray_re::xr_clsid::get(xr_clsid *this,char *s)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if ((this->field_0).bytes[lVar1] == ' ') break;
    s[lVar1] = (this->field_0).bytes[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  s[lVar1] = '\0';
  return;
}

Assistant:

void xr_clsid::get(char* s) const
{
	for (const char *p = bytes, *end = p + 8; p != end; ++p) {
		int c = *p;
		if (c == ' ')
			break;
		*s++ = c;
	}
	*s = '\0';
}